

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_hishelf2_get_heap_size(ma_hishelf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  double dVar2;
  double dVar3;
  double __x;
  double dVar4;
  double dVar5;
  double dVar6;
  ma_biquad_config local_48;
  
  if (pConfig != (ma_hishelf2_config *)0x0) {
    dVar2 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
    dVar3 = sin(dVar2);
    dVar2 = sin(1.5707963267948966 - dVar2);
    __x = pow(10.0,pConfig->gainDB / 40.0);
    dVar4 = (1.0 / pConfig->shelfSlope + -1.0) * (1.0 / __x + __x) + 2.0;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    if (__x < 0.0) {
      dVar5 = sqrt(__x);
    }
    else {
      dVar5 = SQRT(__x);
    }
    dVar6 = dVar3 * 0.5 * dVar4 * (dVar5 + dVar5);
    local_48.format = pConfig->format;
    local_48.channels = pConfig->channels;
    dVar4 = __x + -1.0;
    dVar5 = __x + 1.0;
    dVar3 = dVar4 * dVar2 + dVar5;
    local_48.b2 = (dVar3 - dVar6) * __x;
    local_48.a2 = dVar5 - dVar2 * dVar4;
    local_48.a1 = dVar4 - dVar2 * dVar5;
    local_48.a0 = local_48.a2 + dVar6;
    local_48.a1 = local_48.a1 + local_48.a1;
    local_48.a2 = local_48.a2 - dVar6;
    local_48.b0 = __x * (dVar3 + dVar6);
    local_48.b1 = (dVar5 * dVar2 + dVar4) * __x * -2.0;
    mVar1 = ma_biquad_get_heap_size(&local_48,pHeapSizeInBytes);
    return mVar1;
  }
  __assert_fail("pConfig != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                ,0xbc75,
                "ma_biquad_config ma_hishelf2__get_biquad_config(const ma_hishelf2_config *)");
}

Assistant:

static MA_INLINE ma_biquad_config ma_hishelf2__get_biquad_config(const ma_hishelf2_config* pConfig)
{
    ma_biquad_config bqConfig;
    double w;
    double s;
    double c;
    double A;
    double S;
    double a;
    double sqrtA;

    MA_ASSERT(pConfig != NULL);

    w = 2 * MA_PI_D * pConfig->frequency / pConfig->sampleRate;
    s = ma_sind(w);
    c = ma_cosd(w);
    A = ma_powd(10, (pConfig->gainDB / 40));
    S = pConfig->shelfSlope;
    a = s/2 * ma_sqrtd((A + 1/A) * (1/S - 1) + 2);
    sqrtA = 2*ma_sqrtd(A)*a;

    bqConfig.b0 =  A * ((A + 1) + (A - 1)*c + sqrtA);
    bqConfig.b1 = -2 * A * ((A - 1) + (A + 1)*c);
    bqConfig.b2 =  A * ((A + 1) + (A - 1)*c - sqrtA);
    bqConfig.a0 =  (A + 1) - (A - 1)*c + sqrtA;
    bqConfig.a1 =  2 * ((A - 1) - (A + 1)*c);
    bqConfig.a2 =  (A + 1) - (A - 1)*c - sqrtA;

    bqConfig.format   = pConfig->format;
    bqConfig.channels = pConfig->channels;

    return bqConfig;
}